

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setEnterBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  uint *puVar1;
  uint *puVar2;
  double dVar3;
  Status SVar4;
  pointer pnVar5;
  pointer pnVar6;
  pointer pnVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  double *pdVar15;
  undefined8 *puVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 local_48;
  undefined3 uStack_43;
  int local_40;
  bool local_3c;
  undefined8 local_38;
  
  SVar4 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.rowstat.data[n];
  if (SVar4 == P_FIXED) {
    ::soplex::infinity::__tls_init();
    pdVar15 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar3 = *pdVar15;
    uVar17 = SUB84(dVar3,0);
    uVar18 = (undefined4)((ulong)dVar3 >> 0x20);
    local_38 = 0xa00000000;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_4b = 0;
    local_48 = 0;
    uStack_43 = 0;
    local_40 = 0;
    local_3c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_68,-dVar3);
    pnVar5 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pnVar5[i].m_backend.data = local_68;
    *(undefined8 *)((long)&pnVar5[i].m_backend.data + 8) = uStack_60;
    puVar1 = (uint *)((long)&pnVar5[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_58;
    *(ulong *)(puVar1 + 2) = CONCAT35(uStack_4b,uStack_50);
    *(ulong *)((long)&pnVar5[i].m_backend.data + 0x20) = CONCAT35(uStack_43,local_48);
    pnVar5[i].m_backend.exp = local_40;
    pnVar5[i].m_backend.neg = local_3c;
    pnVar5[i].m_backend.fpclass = (undefined4)local_38;
    pnVar5[i].m_backend.prec_elem = local_38._4_4_;
    ::soplex::infinity::__tls_init();
  }
  else {
    if (SVar4 != P_ON_UPPER) {
      if (SVar4 == P_ON_LOWER) {
        ::soplex::infinity::__tls_init();
        pdVar15 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_38 = 0xa00000000;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_4b = 0;
        local_48 = 0;
        uStack_43 = 0;
        local_40 = 0;
        local_3c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,-*pdVar15);
        pnVar5 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar5[i].m_backend.data = local_68;
        *(undefined8 *)((long)&pnVar5[i].m_backend.data + 8) = uStack_60;
        puVar1 = (uint *)((long)&pnVar5[i].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_58;
        *(ulong *)(puVar1 + 2) = CONCAT35(uStack_4b,uStack_50);
        *(ulong *)((long)&pnVar5[i].m_backend.data + 0x20) = CONCAT35(uStack_43,local_48);
        pnVar5[i].m_backend.exp = local_40;
        pnVar5[i].m_backend.neg = local_3c;
        pnVar5[i].m_backend.fpclass = (undefined4)local_38;
        pnVar5[i].m_backend.prec_elem = local_38._4_4_;
        pnVar5 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar6 = (this->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar6[i].m_backend.data + 0x20) =
             *(undefined8 *)((long)&pnVar5[n].m_backend.data + 0x20);
        uVar11 = *(undefined8 *)&pnVar5[n].m_backend.data;
        uVar12 = *(undefined8 *)((long)&pnVar5[n].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[n].m_backend.data + 0x10);
        uVar13 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar13;
        *(undefined8 *)&pnVar6[i].m_backend.data = uVar11;
        *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8) = uVar12;
        pnVar6[i].m_backend.exp = pnVar5[n].m_backend.exp;
        pnVar6[i].m_backend.neg = pnVar5[n].m_backend.neg;
        iVar14 = pnVar5[n].m_backend.prec_elem;
        pnVar6[i].m_backend.fpclass = pnVar5[n].m_backend.fpclass;
        pnVar6[i].m_backend.prec_elem = iVar14;
        return;
      }
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar6 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar6[i].m_backend.data + 0x20) =
           *(undefined8 *)((long)&pnVar5[n].m_backend.data + 0x20);
      uVar11 = *(undefined8 *)&pnVar5[n].m_backend.data;
      uVar12 = *(undefined8 *)((long)&pnVar5[n].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[n].m_backend.data + 0x10);
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar13;
      *(undefined8 *)&pnVar6[i].m_backend.data = uVar11;
      *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8) = uVar12;
      pnVar6[i].m_backend.exp = pnVar5[n].m_backend.exp;
      pnVar6[i].m_backend.neg = pnVar5[n].m_backend.neg;
      iVar14 = pnVar5[n].m_backend.prec_elem;
      pnVar6[i].m_backend.fpclass = pnVar5[n].m_backend.fpclass;
      pnVar6[i].m_backend.prec_elem = iVar14;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar6 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar6[i].m_backend.data + 0x20) =
           *(undefined8 *)((long)&pnVar5[n].m_backend.data + 0x20);
      uVar11 = *(undefined8 *)&pnVar5[n].m_backend.data;
      uVar12 = *(undefined8 *)((long)&pnVar5[n].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[n].m_backend.data + 0x10);
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar13;
      *(undefined8 *)&pnVar6[i].m_backend.data = uVar11;
      *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8) = uVar12;
      pnVar6[i].m_backend.exp = pnVar5[n].m_backend.exp;
      pnVar6[i].m_backend.neg = pnVar5[n].m_backend.neg;
      iVar14 = pnVar5[n].m_backend.prec_elem;
      pnVar6[i].m_backend.fpclass = pnVar5[n].m_backend.fpclass;
      pnVar6[i].m_backend.prec_elem = iVar14;
      return;
    }
    pnVar6 = (this->theLRbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar7[i].m_backend.data + 0x20) =
         *(undefined8 *)((long)&pnVar6[n].m_backend.data + 0x20);
    pnVar5 = pnVar6 + n;
    uVar17 = (pnVar5->m_backend).data._M_elems[0];
    uVar8 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
    uVar9 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
    uVar10 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar6[n].m_backend.data + 0x10);
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = (uint *)((long)&pnVar7[i].m_backend.data + 0x10);
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    pnVar5 = pnVar7 + i;
    (pnVar5->m_backend).data._M_elems[0] = uVar17;
    *(uint *)((long)&(pnVar5->m_backend).data + 4) = uVar8;
    *(uint *)((long)&(pnVar5->m_backend).data + 8) = uVar9;
    *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = uVar10;
    pnVar7[i].m_backend.exp = pnVar6[n].m_backend.exp;
    pnVar7[i].m_backend.neg = pnVar6[n].m_backend.neg;
    iVar14 = pnVar6[n].m_backend.prec_elem;
    pnVar7[i].m_backend.fpclass = pnVar6[n].m_backend.fpclass;
    pnVar7[i].m_backend.prec_elem = iVar14;
    ::soplex::infinity::__tls_init();
    puVar16 = (undefined8 *)__tls_get_addr(&PTR_003b6b60);
    uVar17 = (undefined4)*puVar16;
    uVar18 = (undefined4)((ulong)*puVar16 >> 0x20);
  }
  local_38 = 0xa00000000;
  local_3c = false;
  local_40 = 0;
  uStack_43 = 0;
  local_48 = 0;
  uStack_4b = 0;
  uStack_50 = 0;
  local_58 = 0;
  uStack_60 = 0;
  local_68 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,(double)CONCAT44(uVar18,uVar17));
  pnVar5 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar5 + i) = local_68;
  *(undefined8 *)((long)(pnVar5 + i) + 8) = uStack_60;
  *(undefined8 *)((long)(pnVar5 + i) + 0x10) = local_58;
  *(ulong *)((long)(pnVar5 + i) + 0x18) = CONCAT35(uStack_4b,uStack_50);
  *(ulong *)((long)(pnVar5 + i) + 0x20) = CONCAT35(uStack_43,local_48);
  *(int *)((long)(pnVar5 + i) + 0x28) = local_40;
  *(bool *)((long)(pnVar5 + i) + 0x2c) = local_3c;
  *(undefined8 *)((long)(pnVar5 + i) + 0x30) = local_38;
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}